

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall HEkkPrimal::basicFeasibilityChangePrice(HEkkPrimal *this)

{
  vector<signed_char,_std::allocator<signed_char>_> *this_00;
  const_reference pvVar1;
  reference pvVar2;
  long *in_RDI;
  HighsSimplexAnalysis *this_01;
  HighsInt unaff_retaddr;
  HVector *in_stack_00000008;
  HVector *in_stack_00000010;
  double local_row_basic_feasibility_change_density;
  HighsSparseMatrix *in_stack_00000020;
  HighsInt iCol;
  vector<signed_char,_std::allocator<signed_char>_> *nonbasicFlag;
  double switch_density;
  bool quad_precision;
  double expected_density;
  bool use_row_price_w_switch;
  bool use_col_price;
  double local_density;
  HighsSimplexInfo *info;
  HighsInt in_stack_000000ec;
  double in_stack_000000f0;
  HighsInt in_stack_000000fc;
  double in_stack_00000100;
  HVector *in_stack_00000108;
  HVector *in_stack_00000110;
  bool in_stack_0000011f;
  HighsSparseMatrix *in_stack_00000120;
  undefined4 in_stack_ffffffffffffff98;
  HighsInt in_stack_ffffffffffffff9c;
  HighsSimplexAnalysis *in_stack_ffffffffffffffa0;
  HighsInt HVar3;
  HighsSimplexAnalysis *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar4;
  HVector *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  undefined1 quad_precision_00;
  uint7 in_stack_ffffffffffffffd0;
  bool local_1a;
  bool local_19;
  double local_18;
  long local_10;
  
  quad_precision_00 = (undefined1)((ulong)in_stack_ffffffffffffffc8 >> 0x38);
  HighsSimplexAnalysis::simplexTimerStart
            (in_stack_ffffffffffffffb0,(HighsInt)((ulong)in_RDI >> 0x20),(HighsInt)in_RDI);
  local_10 = *in_RDI + 0x2560;
  local_18 = ((double)*(int *)((long)in_RDI + 0x40c) * 1.0) / (double)*(int *)((long)in_RDI + 0x14);
  HEkk::choosePriceTechnique
            ((HEkk *)*in_RDI,*(HighsInt *)(*in_RDI + 0x2814),local_18,&local_19,&local_1a);
  if ((*(byte *)(in_RDI[1] + 0xf1) & 1) != 0) {
    HVar3 = (HighsInt)((ulong)in_RDI >> 0x20);
    if ((local_19 & 1U) == 0) {
      if ((local_1a & 1U) == 0) {
        HighsSimplexAnalysis::operationRecordBefore
                  (in_stack_ffffffffffffffb0,HVar3,(HVector *)in_stack_ffffffffffffffa0,
                   (double)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        *(int *)(in_RDI[1] + 0x254) = *(int *)(in_RDI[1] + 0x254) + 1;
      }
      else {
        HighsSimplexAnalysis::operationRecordBefore
                  (in_stack_ffffffffffffffb0,HVar3,(HVector *)in_stack_ffffffffffffffa0,
                   (double)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        *(int *)(in_RDI[1] + 600) = *(int *)(in_RDI[1] + 600) + 1;
      }
    }
    else {
      HighsSimplexAnalysis::operationRecordBefore
                (in_stack_ffffffffffffffb0,HVar3,(HVector *)in_stack_ffffffffffffffa0,
                 (double)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      *(int *)(in_RDI[1] + 0x250) = *(int *)(in_RDI[1] + 0x250) + 1;
    }
  }
  HVar3 = (HighsInt)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  HVectorBase<double>::clear(in_stack_ffffffffffffffc0);
  if ((local_19 & 1U) == 0) {
    if ((local_1a & 1U) == 0) {
      HighsSparseMatrix::priceByRow
                ((HighsSparseMatrix *)(ulong)in_stack_ffffffffffffffd0,(bool)quad_precision_00,
                 in_stack_ffffffffffffffc0,
                 (HVector *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),HVar3);
    }
    else {
      HighsSparseMatrix::priceByRowWithSwitch
                (in_stack_00000120,in_stack_0000011f,in_stack_00000110,in_stack_00000108,
                 in_stack_00000100,in_stack_000000fc,in_stack_000000f0,in_stack_000000ec);
    }
  }
  else {
    HighsSparseMatrix::priceByColumn
              (in_stack_00000020,local_row_basic_feasibility_change_density._7_1_,in_stack_00000010,
               in_stack_00000008,unaff_retaddr);
  }
  if ((local_19 & 1U) != 0) {
    this_00 = (vector<signed_char,_std::allocator<signed_char>_> *)(*in_RDI + 0x2990);
    for (iVar4 = 0; iVar4 < (int)in_RDI[2]; iVar4 = iVar4 + 1) {
      pvVar1 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         (this_00,(long)iVar4);
      in_stack_ffffffffffffffa0 = (HighsSimplexAnalysis *)(double)(int)*pvVar1;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x9b),(long)iVar4);
      *pvVar2 = (double)in_stack_ffffffffffffffa0 * *pvVar2;
    }
  }
  this_01 = (HighsSimplexAnalysis *)
            ((double)*(int *)((long)in_RDI + 0x4bc) / (double)(int)in_RDI[2]);
  HEkk::updateOperationResultDensity((HEkk *)*in_RDI,(double)this_01,(double *)(*in_RDI + 0x2870));
  if ((*(byte *)(in_RDI[1] + 0xf1) & 1) != 0) {
    HighsSimplexAnalysis::operationRecordAfter
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,(HVector *)0x7afb88);
  }
  HighsSimplexAnalysis::simplexTimerStop(this_01,(HighsInt)((ulong)in_RDI >> 0x20),(HighsInt)in_RDI)
  ;
  return;
}

Assistant:

void HEkkPrimal::basicFeasibilityChangePrice() {
  analysis->simplexTimerStart(PriceBasicFeasibilityChangeClock);
  const HighsSimplexInfo& info = ekk_instance_.info_;
  const double local_density =
      1.0 * col_basic_feasibility_change.count / num_row;
  bool use_col_price;
  bool use_row_price_w_switch;
  ekk_instance_.choosePriceTechnique(info.price_strategy, local_density,
                                     use_col_price, use_row_price_w_switch);
  if (analysis->analyse_simplex_summary_data) {
    if (use_col_price) {
      const double expected_density = 1;
      analysis->operationRecordBefore(kSimplexNlaPriceBasicFeasibilityChange,
                                      col_basic_feasibility_change,
                                      expected_density);
      analysis->num_col_price++;
    } else if (use_row_price_w_switch) {
      analysis->operationRecordBefore(
          kSimplexNlaPriceBasicFeasibilityChange, col_basic_feasibility_change,
          ekk_instance_.info_.col_basic_feasibility_change_density);
      analysis->num_row_price_with_switch++;
    } else {
      analysis->operationRecordBefore(
          kSimplexNlaPriceBasicFeasibilityChange, col_basic_feasibility_change,
          ekk_instance_.info_.col_basic_feasibility_change_density);
      analysis->num_row_price++;
    }
  }
  row_basic_feasibility_change.clear();
  const bool quad_precision = false;
  if (use_col_price) {
    // Perform column-wise PRICE
    ekk_instance_.lp_.a_matrix_.priceByColumn(quad_precision,
                                              row_basic_feasibility_change,
                                              col_basic_feasibility_change);
  } else if (use_row_price_w_switch) {
    // Perform hyper-sparse row-wise PRICE, but switch if the density of
    // row_basic_feasibility_change becomes extreme
    //
    const double switch_density = kHyperPriceDensity;
    ekk_instance_.ar_matrix_.priceByRowWithSwitch(
        quad_precision, row_basic_feasibility_change,
        col_basic_feasibility_change, info.row_basic_feasibility_change_density,
        0, switch_density);
  } else {
    // Perform hyper-sparse row-wise PRICE
    ekk_instance_.ar_matrix_.priceByRow(quad_precision,
                                        row_basic_feasibility_change,
                                        col_basic_feasibility_change);
  }
  if (use_col_price) {
    // Column-wise PRICE computes components corresponding to basic
    // variables, so zero these by exploiting the fact that, for basic
    // variables, nonbasicFlag[*]=0
    const std::vector<int8_t>& nonbasicFlag =
        ekk_instance_.basis_.nonbasicFlag_;
    for (HighsInt iCol = 0; iCol < num_col; iCol++)
      row_basic_feasibility_change.array[iCol] *= nonbasicFlag[iCol];
  }
  // Update the record of average row_basic_feasibility_change density
  const double local_row_basic_feasibility_change_density =
      (double)row_basic_feasibility_change.count / num_col;
  ekk_instance_.updateOperationResultDensity(
      local_row_basic_feasibility_change_density,
      ekk_instance_.info_.row_basic_feasibility_change_density);
  if (analysis->analyse_simplex_summary_data)
    analysis->operationRecordAfter(kSimplexNlaPriceBasicFeasibilityChange,
                                   row_basic_feasibility_change);
  analysis->simplexTimerStop(PriceBasicFeasibilityChangeClock);
}